

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O3

void BZ2_compressBlock(EState *s,Bool is_last_block)

{
  UChar (*paUVar1) [258];
  Int32 (*paIVar2) [258];
  short *psVar3;
  UChar UVar4;
  UChar UVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  UInt16 *pUVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  UChar UVar81;
  undefined4 *puVar82;
  undefined8 uVar83;
  UChar (*paUVar84) [258];
  byte bVar85;
  byte bVar86;
  uint uVar87;
  int iVar88;
  uint uVar89;
  long lVar90;
  UInt32 *pUVar91;
  Int32 remF;
  int iVar92;
  int iVar93;
  uint uVar94;
  ulong uVar95;
  size_t sVar96;
  ulong uVar97;
  Bool *pBVar98;
  uint uVar99;
  ushort *puVar100;
  ulong uVar101;
  ulong uVar102;
  int iVar103;
  undefined7 in_register_00000031;
  UChar *pUVar104;
  UChar UVar105;
  long lVar106;
  char cVar107;
  UInt32 UVar108;
  Int32 IVar109;
  UInt16 *pUVar110;
  UChar (*paUVar111) [258];
  size_t sVar112;
  Int32 (*paIVar113) [258];
  bool bVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  long lVar129;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  int iVar173;
  int iVar177;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  UInt16 cost [6];
  Int32 fave [6];
  UChar local_1c8 [24];
  ulong local_1b0;
  uint local_1a8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  undefined1 local_198 [16];
  size_t local_188;
  ulong local_180;
  ulong local_178;
  undefined4 local_16c;
  Bool *local_168;
  UInt32 *local_160;
  size_t local_158;
  ulong local_150;
  UChar (*local_148) [258];
  size_t local_140;
  undefined4 local_138;
  char acStack_134 [260];
  
  iVar93 = s->nblock;
  if (0 < iVar93) {
    uVar87 = s->blockCRC;
    s->blockCRC = ~uVar87;
    s->combinedCRC = (s->combinedCRC << 1 | (uint)((int)s->combinedCRC < 0)) ^ ~uVar87;
    if (1 < s->blockNo) {
      s->numZ = 0;
    }
    BZ2_blockSort(s);
    iVar93 = s->nblock;
  }
  s->zbits = (UChar *)((long)iVar93 + (long)s->arr2);
  if (s->blockNo == 1) {
    s->bsBuff = 0;
    s->bsLive = 0;
    bsPutUChar(s,'B');
    bsPutUChar(s,'Z');
    bsPutUChar(s,'h');
    bsPutUChar(s,(char)s->blockSize100k + '0');
    iVar93 = s->nblock;
  }
  if (iVar93 < 1) goto LAB_005717c8;
  bsPutUChar(s,'1');
  bsPutUChar(s,'A');
  bsPutUChar(s,'Y');
  bsPutUChar(s,'&');
  bsPutUChar(s,'S');
  bsPutUChar(s,'Y');
  bsPutUInt32(s,s->blockCRC);
  iVar93 = s->bsLive;
  if (iVar93 < 8) {
    uVar87 = s->bsBuff;
  }
  else {
    uVar87 = s->bsBuff;
    iVar92 = s->numZ;
    do {
      s->zbits[iVar92] = (UChar)(uVar87 >> 0x18);
      iVar92 = s->numZ + 1;
      s->numZ = iVar92;
      uVar87 = s->bsBuff << 8;
      s->bsBuff = uVar87;
      iVar88 = s->bsLive;
      iVar93 = iVar88 + -8;
      s->bsLive = iVar93;
    } while (0xf < iVar88);
  }
  iVar92 = iVar93 + 1;
  s->bsBuff = uVar87;
  s->bsLive = iVar92;
  iVar88 = s->origPtr;
  local_16c = (int)CONCAT71(in_register_00000031,is_last_block);
  if (6 < iVar93) {
    iVar93 = s->numZ;
    do {
      s->zbits[iVar93] = (UChar)(uVar87 >> 0x18);
      iVar93 = s->numZ + 1;
      s->numZ = iVar93;
      uVar87 = s->bsBuff << 8;
      s->bsBuff = uVar87;
      iVar103 = s->bsLive;
      iVar92 = iVar103 + -8;
      s->bsLive = iVar92;
    } while (0xf < iVar103);
  }
  s->bsBuff = iVar88 << (8U - (char)iVar92 & 0x1f) | uVar87;
  s->bsLive = iVar92 + 0x18;
  pUVar91 = s->ptr;
  pUVar104 = s->block;
  pUVar56 = s->mtfv;
  s->nInUse = 0;
  local_168 = s->inUse;
  uVar87 = 0;
  lVar90 = -0x100;
  do {
    if (s->unseqToSeq[lVar90] != '\0') {
      *(char *)((long)s->mtfFreq + lVar90 + -0x20) = (char)uVar87;
      uVar87 = uVar87 + 1;
      s->nInUse = uVar87;
    }
    lVar90 = lVar90 + 1;
  } while (lVar90 != 0);
  if ((-2 < (int)uVar87) && (memset(s->mtfFreq,0,(ulong)(uVar87 + 2) << 2), 0 < (int)uVar87)) {
    lVar90 = (ulong)uVar87 - 1;
    local_198._8_4_ = (int)lVar90;
    local_198._0_8_ = lVar90;
    local_198._12_4_ = (int)((ulong)lVar90 >> 0x20);
    uVar95 = 0;
    auVar115 = local_198;
    auVar132 = _DAT_005d71b0;
    auVar130 = _DAT_005d71c0;
    auVar135 = _DAT_005d71d0;
    auVar143 = _DAT_005d71e0;
    auVar144 = _DAT_005d6f50;
    auVar146 = _DAT_005d6f60;
    auVar147 = _DAT_005d6f70;
    auVar148 = _DAT_005d6230;
    do {
      auVar158 = local_198 ^ _DAT_005d6240;
      auVar160 = auVar148 ^ _DAT_005d6240;
      iVar93 = auVar158._0_4_;
      iVar173 = -(uint)(iVar93 < auVar160._0_4_);
      iVar92 = auVar158._4_4_;
      auVar162._4_4_ = -(uint)(iVar92 < auVar160._4_4_);
      iVar88 = auVar158._8_4_;
      iVar177 = -(uint)(iVar88 < auVar160._8_4_);
      iVar103 = auVar158._12_4_;
      auVar162._12_4_ = -(uint)(iVar103 < auVar160._12_4_);
      auVar158._4_4_ = iVar173;
      auVar158._0_4_ = iVar173;
      auVar158._8_4_ = iVar177;
      auVar158._12_4_ = iVar177;
      auVar158 = pshuflw(auVar115,auVar158,0xe8);
      auVar161._4_4_ = -(uint)(auVar160._4_4_ == iVar92);
      auVar161._12_4_ = -(uint)(auVar160._12_4_ == iVar103);
      auVar161._0_4_ = auVar161._4_4_;
      auVar161._8_4_ = auVar161._12_4_;
      auVar149 = pshuflw(in_XMM11,auVar161,0xe8);
      auVar162._0_4_ = auVar162._4_4_;
      auVar162._8_4_ = auVar162._12_4_;
      auVar160 = pshuflw(auVar158,auVar162,0xe8);
      auVar115._8_4_ = 0xffffffff;
      auVar115._0_8_ = 0xffffffffffffffff;
      auVar115._12_4_ = 0xffffffff;
      auVar115 = (auVar160 | auVar149 & auVar158) ^ auVar115;
      auVar115 = packssdw(auVar115,auVar115);
      cVar107 = (char)uVar95;
      if ((auVar115 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)&local_138 + uVar95) = cVar107;
      }
      auVar149._4_4_ = iVar173;
      auVar149._0_4_ = iVar173;
      auVar149._8_4_ = iVar177;
      auVar149._12_4_ = iVar177;
      auVar162 = auVar161 & auVar149 | auVar162;
      auVar115 = packssdw(auVar162,auVar162);
      auVar160._8_4_ = 0xffffffff;
      auVar160._0_8_ = 0xffffffffffffffff;
      auVar160._12_4_ = 0xffffffff;
      auVar115 = packssdw(auVar115 ^ auVar160,auVar115 ^ auVar160);
      auVar115 = packsswb(auVar115,auVar115);
      if ((auVar115._0_4_ >> 8 & 1) != 0) {
        *(char *)((long)&local_138 + uVar95 + 1) = cVar107 + '\x01';
      }
      auVar115 = auVar147 ^ _DAT_005d6240;
      auVar150._0_4_ = -(uint)(iVar93 < auVar115._0_4_);
      auVar150._4_4_ = -(uint)(iVar92 < auVar115._4_4_);
      auVar150._8_4_ = -(uint)(iVar88 < auVar115._8_4_);
      auVar150._12_4_ = -(uint)(iVar103 < auVar115._12_4_);
      auVar163._4_4_ = auVar150._0_4_;
      auVar163._0_4_ = auVar150._0_4_;
      auVar163._8_4_ = auVar150._8_4_;
      auVar163._12_4_ = auVar150._8_4_;
      iVar173 = -(uint)(auVar115._4_4_ == iVar92);
      iVar177 = -(uint)(auVar115._12_4_ == iVar103);
      auVar66._4_4_ = iVar173;
      auVar66._0_4_ = iVar173;
      auVar66._8_4_ = iVar177;
      auVar66._12_4_ = iVar177;
      auVar174._4_4_ = auVar150._4_4_;
      auVar174._0_4_ = auVar150._4_4_;
      auVar174._8_4_ = auVar150._12_4_;
      auVar174._12_4_ = auVar150._12_4_;
      auVar115 = auVar66 & auVar163 | auVar174;
      auVar115 = packssdw(auVar115,auVar115);
      auVar57._8_4_ = 0xffffffff;
      auVar57._0_8_ = 0xffffffffffffffff;
      auVar57._12_4_ = 0xffffffff;
      auVar115 = packssdw(auVar115 ^ auVar57,auVar115 ^ auVar57);
      auVar115 = packsswb(auVar115,auVar115);
      if ((auVar115._0_4_ >> 0x10 & 1) != 0) {
        *(char *)((long)&local_138 + uVar95 + 2) = cVar107 + '\x02';
      }
      auVar115 = pshufhw(auVar115,auVar163,0x84);
      auVar67._4_4_ = iVar173;
      auVar67._0_4_ = iVar173;
      auVar67._8_4_ = iVar177;
      auVar67._12_4_ = iVar177;
      auVar160 = pshufhw(auVar150,auVar67,0x84);
      auVar158 = pshufhw(auVar115,auVar174,0x84);
      auVar116._8_4_ = 0xffffffff;
      auVar116._0_8_ = 0xffffffffffffffff;
      auVar116._12_4_ = 0xffffffff;
      auVar116 = (auVar158 | auVar160 & auVar115) ^ auVar116;
      auVar115 = packssdw(auVar116,auVar116);
      auVar115 = packsswb(auVar115,auVar115);
      if ((auVar115._0_4_ >> 0x18 & 1) != 0) {
        *(char *)((long)&local_138 + uVar95 + 3) = cVar107 + '\x03';
      }
      auVar115 = auVar146 ^ _DAT_005d6240;
      auVar151._0_4_ = -(uint)(iVar93 < auVar115._0_4_);
      auVar151._4_4_ = -(uint)(iVar92 < auVar115._4_4_);
      auVar151._8_4_ = -(uint)(iVar88 < auVar115._8_4_);
      auVar151._12_4_ = -(uint)(iVar103 < auVar115._12_4_);
      auVar68._4_4_ = auVar151._0_4_;
      auVar68._0_4_ = auVar151._0_4_;
      auVar68._8_4_ = auVar151._8_4_;
      auVar68._12_4_ = auVar151._8_4_;
      auVar160 = pshuflw(auVar174,auVar68,0xe8);
      auVar117._0_4_ = -(uint)(auVar115._0_4_ == iVar93);
      auVar117._4_4_ = -(uint)(auVar115._4_4_ == iVar92);
      auVar117._8_4_ = -(uint)(auVar115._8_4_ == iVar88);
      auVar117._12_4_ = -(uint)(auVar115._12_4_ == iVar103);
      auVar164._4_4_ = auVar117._4_4_;
      auVar164._0_4_ = auVar117._4_4_;
      auVar164._8_4_ = auVar117._12_4_;
      auVar164._12_4_ = auVar117._12_4_;
      auVar115 = pshuflw(auVar117,auVar164,0xe8);
      auVar165._4_4_ = auVar151._4_4_;
      auVar165._0_4_ = auVar151._4_4_;
      auVar165._8_4_ = auVar151._12_4_;
      auVar165._12_4_ = auVar151._12_4_;
      auVar158 = pshuflw(auVar151,auVar165,0xe8);
      auVar58._8_4_ = 0xffffffff;
      auVar58._0_8_ = 0xffffffffffffffff;
      auVar58._12_4_ = 0xffffffff;
      auVar115 = packssdw(auVar115 & auVar160,(auVar158 | auVar115 & auVar160) ^ auVar58);
      auVar115 = packsswb(auVar115,auVar115);
      if ((auVar115 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        acStack_134[uVar95] = cVar107 + '\x04';
      }
      auVar69._4_4_ = auVar151._0_4_;
      auVar69._0_4_ = auVar151._0_4_;
      auVar69._8_4_ = auVar151._8_4_;
      auVar69._12_4_ = auVar151._8_4_;
      auVar165 = auVar164 & auVar69 | auVar165;
      auVar158 = packssdw(auVar165,auVar165);
      auVar59._8_4_ = 0xffffffff;
      auVar59._0_8_ = 0xffffffffffffffff;
      auVar59._12_4_ = 0xffffffff;
      auVar115 = packssdw(auVar115,auVar158 ^ auVar59);
      auVar115 = packsswb(auVar115,auVar115);
      if ((auVar115._4_2_ >> 8 & 1) != 0) {
        acStack_134[uVar95 + 1] = cVar107 + '\x05';
      }
      auVar115 = auVar144 ^ _DAT_005d6240;
      auVar152._0_4_ = -(uint)(iVar93 < auVar115._0_4_);
      auVar152._4_4_ = -(uint)(iVar92 < auVar115._4_4_);
      auVar152._8_4_ = -(uint)(iVar88 < auVar115._8_4_);
      auVar152._12_4_ = -(uint)(iVar103 < auVar115._12_4_);
      auVar166._4_4_ = auVar152._0_4_;
      auVar166._0_4_ = auVar152._0_4_;
      auVar166._8_4_ = auVar152._8_4_;
      auVar166._12_4_ = auVar152._8_4_;
      iVar173 = -(uint)(auVar115._4_4_ == iVar92);
      iVar177 = -(uint)(auVar115._12_4_ == iVar103);
      auVar70._4_4_ = iVar173;
      auVar70._0_4_ = iVar173;
      auVar70._8_4_ = iVar177;
      auVar70._12_4_ = iVar177;
      auVar175._4_4_ = auVar152._4_4_;
      auVar175._0_4_ = auVar152._4_4_;
      auVar175._8_4_ = auVar152._12_4_;
      auVar175._12_4_ = auVar152._12_4_;
      auVar115 = auVar70 & auVar166 | auVar175;
      auVar115 = packssdw(auVar115,auVar115);
      auVar60._8_4_ = 0xffffffff;
      auVar60._0_8_ = 0xffffffffffffffff;
      auVar60._12_4_ = 0xffffffff;
      auVar115 = packssdw(auVar115 ^ auVar60,auVar115 ^ auVar60);
      auVar115 = packsswb(auVar115,auVar115);
      if ((auVar115 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        acStack_134[uVar95 + 2] = cVar107 + '\x06';
      }
      auVar115 = pshufhw(auVar115,auVar166,0x84);
      auVar71._4_4_ = iVar173;
      auVar71._0_4_ = iVar173;
      auVar71._8_4_ = iVar177;
      auVar71._12_4_ = iVar177;
      auVar160 = pshufhw(auVar152,auVar71,0x84);
      auVar158 = pshufhw(auVar115,auVar175,0x84);
      auVar118._8_4_ = 0xffffffff;
      auVar118._0_8_ = 0xffffffffffffffff;
      auVar118._12_4_ = 0xffffffff;
      auVar118 = (auVar158 | auVar160 & auVar115) ^ auVar118;
      auVar115 = packssdw(auVar118,auVar118);
      auVar115 = packsswb(auVar115,auVar115);
      if ((auVar115._6_2_ >> 8 & 1) != 0) {
        acStack_134[uVar95 + 3] = cVar107 + '\a';
      }
      auVar115 = auVar143 ^ _DAT_005d6240;
      auVar153._0_4_ = -(uint)(iVar93 < auVar115._0_4_);
      auVar153._4_4_ = -(uint)(iVar92 < auVar115._4_4_);
      auVar153._8_4_ = -(uint)(iVar88 < auVar115._8_4_);
      auVar153._12_4_ = -(uint)(iVar103 < auVar115._12_4_);
      auVar72._4_4_ = auVar153._0_4_;
      auVar72._0_4_ = auVar153._0_4_;
      auVar72._8_4_ = auVar153._8_4_;
      auVar72._12_4_ = auVar153._8_4_;
      auVar160 = pshuflw(auVar175,auVar72,0xe8);
      auVar119._0_4_ = -(uint)(auVar115._0_4_ == iVar93);
      auVar119._4_4_ = -(uint)(auVar115._4_4_ == iVar92);
      auVar119._8_4_ = -(uint)(auVar115._8_4_ == iVar88);
      auVar119._12_4_ = -(uint)(auVar115._12_4_ == iVar103);
      auVar167._4_4_ = auVar119._4_4_;
      auVar167._0_4_ = auVar119._4_4_;
      auVar167._8_4_ = auVar119._12_4_;
      auVar167._12_4_ = auVar119._12_4_;
      auVar115 = pshuflw(auVar119,auVar167,0xe8);
      auVar168._4_4_ = auVar153._4_4_;
      auVar168._0_4_ = auVar153._4_4_;
      auVar168._8_4_ = auVar153._12_4_;
      auVar168._12_4_ = auVar153._12_4_;
      auVar158 = pshuflw(auVar153,auVar168,0xe8);
      auVar154._8_4_ = 0xffffffff;
      auVar154._0_8_ = 0xffffffffffffffff;
      auVar154._12_4_ = 0xffffffff;
      auVar154 = (auVar158 | auVar115 & auVar160) ^ auVar154;
      auVar158 = packssdw(auVar154,auVar154);
      auVar115 = packsswb(auVar115 & auVar160,auVar158);
      if ((auVar115 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        acStack_134[uVar95 + 4] = cVar107 + '\b';
      }
      auVar73._4_4_ = auVar153._0_4_;
      auVar73._0_4_ = auVar153._0_4_;
      auVar73._8_4_ = auVar153._8_4_;
      auVar73._12_4_ = auVar153._8_4_;
      auVar168 = auVar167 & auVar73 | auVar168;
      auVar158 = packssdw(auVar168,auVar168);
      auVar61._8_4_ = 0xffffffff;
      auVar61._0_8_ = 0xffffffffffffffff;
      auVar61._12_4_ = 0xffffffff;
      auVar158 = packssdw(auVar158 ^ auVar61,auVar158 ^ auVar61);
      auVar115 = packsswb(auVar115,auVar158);
      if ((auVar115._8_2_ >> 8 & 1) != 0) {
        acStack_134[uVar95 + 5] = cVar107 + '\t';
      }
      auVar115 = auVar135 ^ _DAT_005d6240;
      auVar155._0_4_ = -(uint)(iVar93 < auVar115._0_4_);
      auVar155._4_4_ = -(uint)(iVar92 < auVar115._4_4_);
      auVar155._8_4_ = -(uint)(iVar88 < auVar115._8_4_);
      auVar155._12_4_ = -(uint)(iVar103 < auVar115._12_4_);
      auVar169._4_4_ = auVar155._0_4_;
      auVar169._0_4_ = auVar155._0_4_;
      auVar169._8_4_ = auVar155._8_4_;
      auVar169._12_4_ = auVar155._8_4_;
      iVar173 = -(uint)(auVar115._4_4_ == iVar92);
      iVar177 = -(uint)(auVar115._12_4_ == iVar103);
      auVar74._4_4_ = iVar173;
      auVar74._0_4_ = iVar173;
      auVar74._8_4_ = iVar177;
      auVar74._12_4_ = iVar177;
      auVar176._4_4_ = auVar155._4_4_;
      auVar176._0_4_ = auVar155._4_4_;
      auVar176._8_4_ = auVar155._12_4_;
      auVar176._12_4_ = auVar155._12_4_;
      auVar115 = auVar74 & auVar169 | auVar176;
      auVar115 = packssdw(auVar115,auVar115);
      auVar62._8_4_ = 0xffffffff;
      auVar62._0_8_ = 0xffffffffffffffff;
      auVar62._12_4_ = 0xffffffff;
      auVar115 = packssdw(auVar115 ^ auVar62,auVar115 ^ auVar62);
      auVar115 = packsswb(auVar115,auVar115);
      if ((auVar115 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        acStack_134[uVar95 + 6] = cVar107 + '\n';
      }
      auVar115 = pshufhw(auVar115,auVar169,0x84);
      auVar75._4_4_ = iVar173;
      auVar75._0_4_ = iVar173;
      auVar75._8_4_ = iVar177;
      auVar75._12_4_ = iVar177;
      auVar160 = pshufhw(auVar155,auVar75,0x84);
      auVar158 = pshufhw(auVar115,auVar176,0x84);
      auVar120._8_4_ = 0xffffffff;
      auVar120._0_8_ = 0xffffffffffffffff;
      auVar120._12_4_ = 0xffffffff;
      auVar120 = (auVar158 | auVar160 & auVar115) ^ auVar120;
      auVar115 = packssdw(auVar120,auVar120);
      auVar115 = packsswb(auVar115,auVar115);
      if ((auVar115._10_2_ >> 8 & 1) != 0) {
        acStack_134[uVar95 + 7] = cVar107 + '\v';
      }
      auVar115 = auVar130 ^ _DAT_005d6240;
      auVar156._0_4_ = -(uint)(iVar93 < auVar115._0_4_);
      auVar156._4_4_ = -(uint)(iVar92 < auVar115._4_4_);
      auVar156._8_4_ = -(uint)(iVar88 < auVar115._8_4_);
      auVar156._12_4_ = -(uint)(iVar103 < auVar115._12_4_);
      auVar76._4_4_ = auVar156._0_4_;
      auVar76._0_4_ = auVar156._0_4_;
      auVar76._8_4_ = auVar156._8_4_;
      auVar76._12_4_ = auVar156._8_4_;
      auVar160 = pshuflw(auVar176,auVar76,0xe8);
      auVar121._0_4_ = -(uint)(auVar115._0_4_ == iVar93);
      auVar121._4_4_ = -(uint)(auVar115._4_4_ == iVar92);
      auVar121._8_4_ = -(uint)(auVar115._8_4_ == iVar88);
      auVar121._12_4_ = -(uint)(auVar115._12_4_ == iVar103);
      auVar170._4_4_ = auVar121._4_4_;
      auVar170._0_4_ = auVar121._4_4_;
      auVar170._8_4_ = auVar121._12_4_;
      auVar170._12_4_ = auVar121._12_4_;
      auVar115 = pshuflw(auVar121,auVar170,0xe8);
      auVar171._4_4_ = auVar156._4_4_;
      auVar171._0_4_ = auVar156._4_4_;
      auVar171._8_4_ = auVar156._12_4_;
      auVar171._12_4_ = auVar156._12_4_;
      auVar158 = pshuflw(auVar156,auVar171,0xe8);
      auVar63._8_4_ = 0xffffffff;
      auVar63._0_8_ = 0xffffffffffffffff;
      auVar63._12_4_ = 0xffffffff;
      auVar115 = packssdw(auVar115 & auVar160,(auVar158 | auVar115 & auVar160) ^ auVar63);
      auVar115 = packsswb(auVar115,auVar115);
      if ((auVar115 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        acStack_134[uVar95 + 8] = cVar107 + '\f';
      }
      auVar77._4_4_ = auVar156._0_4_;
      auVar77._0_4_ = auVar156._0_4_;
      auVar77._8_4_ = auVar156._8_4_;
      auVar77._12_4_ = auVar156._8_4_;
      auVar171 = auVar170 & auVar77 | auVar171;
      auVar158 = packssdw(auVar171,auVar171);
      auVar64._8_4_ = 0xffffffff;
      auVar64._0_8_ = 0xffffffffffffffff;
      auVar64._12_4_ = 0xffffffff;
      auVar115 = packssdw(auVar115,auVar158 ^ auVar64);
      auVar115 = packsswb(auVar115,auVar115);
      if ((auVar115._12_2_ >> 8 & 1) != 0) {
        acStack_134[uVar95 + 9] = cVar107 + '\r';
      }
      auVar115 = auVar132 ^ _DAT_005d6240;
      auVar157._0_4_ = -(uint)(iVar93 < auVar115._0_4_);
      auVar157._4_4_ = -(uint)(iVar92 < auVar115._4_4_);
      auVar157._8_4_ = -(uint)(iVar88 < auVar115._8_4_);
      auVar157._12_4_ = -(uint)(iVar103 < auVar115._12_4_);
      auVar172._4_4_ = auVar157._0_4_;
      auVar172._0_4_ = auVar157._0_4_;
      auVar172._8_4_ = auVar157._8_4_;
      auVar172._12_4_ = auVar157._8_4_;
      iVar93 = -(uint)(auVar115._4_4_ == iVar92);
      iVar92 = -(uint)(auVar115._12_4_ == iVar103);
      auVar159._4_4_ = iVar93;
      auVar159._0_4_ = iVar93;
      auVar159._8_4_ = iVar92;
      auVar159._12_4_ = iVar92;
      auVar122._4_4_ = auVar157._4_4_;
      auVar122._0_4_ = auVar157._4_4_;
      auVar122._8_4_ = auVar157._12_4_;
      auVar122._12_4_ = auVar157._12_4_;
      auVar122 = auVar159 & auVar172 | auVar122;
      auVar115 = packssdw(auVar122,auVar122);
      auVar65._8_4_ = 0xffffffff;
      auVar65._0_8_ = 0xffffffffffffffff;
      auVar65._12_4_ = 0xffffffff;
      auVar115 = packssdw(auVar115 ^ auVar65,auVar115 ^ auVar65);
      auVar115 = packsswb(auVar115,auVar115);
      if ((auVar115 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        acStack_134[uVar95 + 10] = cVar107 + '\x0e';
      }
      auVar115 = pshufhw(auVar115,auVar172,0x84);
      in_XMM11 = pshufhw(auVar157,auVar159,0x84);
      in_XMM11 = in_XMM11 & auVar115;
      auVar78._4_4_ = auVar157._4_4_;
      auVar78._0_4_ = auVar157._4_4_;
      auVar78._8_4_ = auVar157._12_4_;
      auVar78._12_4_ = auVar157._12_4_;
      auVar115 = pshufhw(auVar115,auVar78,0x84);
      auVar123._8_4_ = 0xffffffff;
      auVar123._0_8_ = 0xffffffffffffffff;
      auVar123._12_4_ = 0xffffffff;
      auVar123 = (auVar115 | in_XMM11) ^ auVar123;
      auVar115 = packssdw(auVar123,auVar123);
      auVar115 = packsswb(auVar115,auVar115);
      if ((auVar115._14_2_ >> 8 & 1) != 0) {
        acStack_134[uVar95 + 0xb] = cVar107 + '\x0f';
      }
      uVar95 = uVar95 + 0x10;
      lVar90 = (long)DAT_005d7220;
      lVar129 = auVar148._8_8_;
      auVar148._0_8_ = auVar148._0_8_ + lVar90;
      lVar106 = DAT_005d7220._8_8_;
      auVar148._8_8_ = lVar129 + lVar106;
      lVar129 = auVar147._8_8_;
      auVar147._0_8_ = auVar147._0_8_ + lVar90;
      auVar147._8_8_ = lVar129 + lVar106;
      lVar129 = auVar146._8_8_;
      auVar146._0_8_ = auVar146._0_8_ + lVar90;
      auVar146._8_8_ = lVar129 + lVar106;
      lVar129 = auVar144._8_8_;
      auVar144._0_8_ = auVar144._0_8_ + lVar90;
      auVar144._8_8_ = lVar129 + lVar106;
      lVar129 = auVar143._8_8_;
      auVar143._0_8_ = auVar143._0_8_ + lVar90;
      auVar143._8_8_ = lVar129 + lVar106;
      lVar129 = auVar135._8_8_;
      auVar135._0_8_ = auVar135._0_8_ + lVar90;
      auVar135._8_8_ = lVar129 + lVar106;
      lVar129 = auVar130._8_8_;
      auVar130._0_8_ = auVar130._0_8_ + lVar90;
      auVar130._8_8_ = lVar129 + lVar106;
      lVar129 = auVar132._8_8_;
      auVar132._0_8_ = auVar132._0_8_ + lVar90;
      auVar132._8_8_ = lVar129 + lVar106;
      auVar115 = _DAT_005d7220;
    } while ((uVar87 + 0xf & 0xfffffff0) != uVar95);
  }
  uVar94 = s->nblock;
  if ((int)uVar94 < 1) {
    iVar93 = 0;
  }
  else {
    lVar90 = 0;
    iVar92 = 0;
    iVar93 = 0;
    UVar105 = (UChar)local_138;
    do {
      UVar81 = local_138._1_1_;
      UVar4 = s->unseqToSeq
              [pUVar104[(int)(pUVar91[lVar90] + ((int)(pUVar91[lVar90] - 1) >> 0x1f & uVar94) + -1)]
              ];
      if (UVar105 == UVar4) {
        iVar92 = iVar92 + 1;
      }
      else {
        if (0 < iVar92) {
          uVar94 = iVar92 - 1;
          pUVar110 = pUVar56 + iVar93;
          while( true ) {
            iVar93 = iVar93 + 1;
            bVar114 = (uVar94 & 1) != 0;
            if (bVar114) {
              s->mtfFreq[1] = s->mtfFreq[1] + 1;
            }
            else {
              s->mtfFreq[0] = s->mtfFreq[0] + 1;
            }
            *pUVar110 = (ushort)bVar114;
            if ((int)uVar94 < 2) break;
            uVar94 = uVar94 - 2 >> 1;
            pUVar110 = pUVar110 + 1;
          }
          iVar92 = 0;
        }
        local_138._1_1_ = (UChar)local_138;
        puVar82 = &local_138;
        while (UVar4 != UVar81) {
          UVar105 = *(UChar *)((long)puVar82 + 2);
          *(UChar *)((long)puVar82 + 2) = UVar81;
          UVar81 = UVar105;
          puVar82 = (undefined4 *)((long)puVar82 + 1);
        }
        iVar88 = ((int)(undefined4 *)((long)puVar82 + 1) - (int)&local_138) + 1;
        pUVar56[iVar93] = (UInt16)iVar88;
        s->mtfFreq[iVar88] = s->mtfFreq[iVar88] + 1;
        iVar93 = iVar93 + 1;
        uVar94 = s->nblock;
        local_138._0_1_ = UVar4;
      }
      lVar90 = lVar90 + 1;
      UVar105 = UVar4;
    } while (lVar90 < (int)uVar94);
    if (0 < iVar92) {
      uVar94 = iVar92 - 1;
      puVar100 = pUVar56 + iVar93;
      while( true ) {
        iVar93 = iVar93 + 1;
        bVar114 = (uVar94 & 1) != 0;
        if (bVar114) {
          s->mtfFreq[1] = s->mtfFreq[1] + 1;
        }
        else {
          s->mtfFreq[0] = s->mtfFreq[0] + 1;
        }
        *puVar100 = (ushort)bVar114;
        if ((int)uVar94 < 2) break;
        uVar94 = uVar94 - 2 >> 1;
        puVar100 = puVar100 + 1;
      }
    }
  }
  pUVar56[iVar93] = (short)uVar87 + 1;
  s->mtfFreq[(long)(int)uVar87 + 1] = s->mtfFreq[(long)(int)uVar87 + 1] + 1;
  s->nMTF = iVar93 + 1;
  iVar93 = s->nInUse;
  uVar87 = iVar93 + 2;
  sVar112 = 1;
  if (1 < (int)uVar87) {
    sVar112 = (size_t)uVar87;
  }
  paUVar1 = s->len;
  lVar90 = 0;
  do {
    if (-2 < iVar93) {
      memset(*paUVar1 + lVar90,0xf,sVar112);
    }
    lVar90 = lVar90 + 0x102;
  } while (lVar90 != 0x60c);
  uVar94 = s->nMTF;
  if ((int)uVar94 < 1) {
    bz_internal_error(0xbb9);
    uVar94 = s->nMTF;
  }
  auVar130 = _DAT_005d6250;
  auVar132 = _DAT_005d6240;
  auVar115 = _DAT_005d6230;
  iVar92 = 0;
  if ((int)uVar94 < 200) {
    uVar89 = 2;
LAB_0056ec14:
    local_1b0 = 0;
  }
  else {
    if (uVar94 < 600) {
      uVar89 = 3;
      goto LAB_0056ec14;
    }
    if (uVar94 < 0x4b0) {
      uVar89 = 4;
      goto LAB_0056ec14;
    }
    local_1b0 = (ulong)(0x95f < uVar94);
    uVar89 = (0x95f < uVar94) + 5;
  }
  uVar97 = (ulong)uVar89;
  lVar90 = sVar112 - 1;
  auVar124._8_4_ = (int)lVar90;
  auVar124._0_8_ = lVar90;
  auVar124._12_4_ = (int)((ulong)lVar90 >> 0x20);
  pUVar104 = s->selectorMtf + (ulong)(uVar89 * 0x102) + 0x4551;
  auVar124 = auVar124 ^ _DAT_005d6240;
  uVar95 = uVar97;
  do {
    iVar88 = (int)uVar94 / (int)uVar95;
    uVar99 = iVar92 - 1;
    uVar102 = (ulong)uVar99;
    iVar103 = 0;
    if ((0 < iVar88) && ((int)uVar99 <= iVar93)) {
      lVar90 = (long)(int)uVar99 << 0x20;
      iVar103 = 0;
      uVar101 = (long)(int)uVar99;
      do {
        lVar90 = lVar90 + 0x100000000;
        iVar103 = iVar103 + s->mtfFreq[uVar101 + 1];
        uVar102 = uVar101 + 1;
        if ((long)iVar93 <= (long)uVar101) break;
        uVar101 = uVar102;
      } while (iVar103 < iVar88);
      if (((iVar92 < (int)uVar102) && (uVar95 != 1 && uVar95 != uVar97)) &&
         ((uVar89 - (int)uVar95 & 0x80000001) == 1)) {
        iVar103 = iVar103 - *(int *)((long)s->mtfFreq + (lVar90 >> 0x1e));
        uVar102 = (ulong)((int)uVar102 - 1);
      }
    }
    iVar88 = (int)uVar102;
    if (-2 < iVar93) {
      uVar102 = 0;
      auVar145 = auVar115;
      do {
        bVar114 = auVar124._0_4_ < SUB164(auVar145 ^ auVar132,0);
        iVar173 = auVar124._4_4_;
        iVar177 = SUB164(auVar145 ^ auVar132,4);
        if ((bool)(~(iVar173 < iVar177 || iVar177 == iVar173 && bVar114) & 1)) {
          UVar105 = '\0';
          if ((long)iVar88 < (long)uVar102) {
            UVar105 = '\x0f';
          }
          if ((long)uVar102 < (long)iVar92) {
            UVar105 = '\x0f';
          }
          pUVar104[uVar102 - 1] = UVar105;
        }
        if (iVar173 >= iVar177 && (iVar177 != iVar173 || !bVar114)) {
          UVar105 = '\0';
          if ((long)iVar88 <= (long)uVar102) {
            UVar105 = '\x0f';
          }
          if ((long)(uVar102 + 1) < (long)iVar92) {
            UVar105 = '\x0f';
          }
          pUVar104[uVar102] = UVar105;
        }
        uVar102 = uVar102 + 2;
        lVar90 = auVar145._8_8_;
        auVar145._0_8_ = auVar145._0_8_ + auVar130._0_8_;
        auVar145._8_8_ = lVar90 + auVar130._8_8_;
      } while (((int)sVar112 + 1U & 0xfffffffe) != uVar102);
    }
    iVar92 = iVar88 + 1;
    uVar94 = uVar94 - iVar103;
    pUVar104 = pUVar104 + -0x102;
    bVar114 = 1 < (long)uVar95;
    uVar95 = uVar95 - 1;
  } while (bVar114);
  paIVar2 = s->rfreq;
  local_158 = (size_t)(uVar89 * 4);
  local_140 = sVar112 * 4;
  local_180 = (ulong)(uVar89 * 2);
  bVar85 = -2 < iVar93 & (byte)local_1b0;
  local_160 = s->len_pack[0] + 2;
  local_148 = s->len;
  uVar95 = 0;
  local_1a8 = uVar87;
  local_188 = sVar112;
  local_178 = uVar97;
  do {
    sVar112 = local_188;
    local_150 = uVar95;
    memset(&local_138,0,local_158);
    uVar95 = 0;
    do {
      while (-2 < iVar93) {
        memset(paIVar2 + uVar95,0,local_140);
        uVar95 = uVar95 + 1;
        if (uVar95 == uVar97) {
          if (bVar85 != 0) {
            sVar96 = 0;
            pUVar91 = local_160;
            do {
              (*(UInt32 (*) [4])(pUVar91 + -2))[0] =
                   (uint)s->len[0][sVar96] | (uint)s->len[1][sVar96] << 0x10;
              pUVar91[-1] = (uint)s->len[2][sVar96] | (uint)s->len[3][sVar96] << 0x10;
              *pUVar91 = (uint)s->len[4][sVar96] | (uint)s->len[5][sVar96] << 0x10;
              sVar96 = sVar96 + 1;
              pUVar91 = pUVar91 + 4;
            } while (sVar112 != sVar96);
          }
          goto LAB_0056ef07;
        }
      }
      uVar95 = uVar95 + 1;
    } while (uVar95 != uVar97);
LAB_0056ef07:
    iVar92 = s->nMTF;
    paUVar111 = paUVar1;
    paIVar113 = paIVar2;
    if (iVar92 < 1) {
      auVar80._8_8_ = 0;
      auVar80._0_8_ = local_198._8_8_;
      local_198 = auVar80 << 0x40;
      uVar95 = uVar97;
    }
    else {
      auVar79._8_8_ = 0;
      auVar79._0_8_ = local_198._8_8_;
      local_198 = auVar79 << 0x40;
      iVar88 = 0;
      do {
        memset(&local_1a4,0,local_180);
        paUVar84 = local_148;
        uVar95 = local_178;
        iVar103 = iVar92 + -1;
        if (iVar88 + 0x31 < iVar92) {
          iVar103 = iVar88 + 0x31;
        }
        bVar86 = iVar103 - iVar88 == 0x31 & (byte)local_1b0;
        uVar83 = local_198._0_8_;
        if (bVar86 == 0) {
          if (iVar88 <= iVar103) {
            lVar90 = (long)iVar88;
            do {
              pUVar104 = *paUVar84 + pUVar56[lVar90];
              uVar97 = 0;
              do {
                psVar3 = (short *)((long)&local_1a4 + uVar97 * 2);
                *psVar3 = *psVar3 + (ushort)*pUVar104;
                uVar97 = uVar97 + 1;
                pUVar104 = pUVar104 + 0x102;
              } while (uVar95 != uVar97);
              lVar90 = lVar90 + 1;
            } while (iVar103 + 1 != (int)lVar90);
          }
        }
        else {
          uVar6 = pUVar56[iVar88];
          uVar7 = pUVar56[(long)iVar88 + 1];
          uVar8 = pUVar56[(long)iVar88 + 2];
          uVar9 = pUVar56[(long)iVar88 + 3];
          uVar10 = pUVar56[(long)iVar88 + 4];
          uVar11 = pUVar56[(long)iVar88 + 5];
          uVar12 = pUVar56[(long)iVar88 + 6];
          uVar13 = pUVar56[(long)iVar88 + 7];
          uVar14 = pUVar56[(long)iVar88 + 8];
          uVar15 = pUVar56[(long)iVar88 + 9];
          uVar16 = pUVar56[(long)iVar88 + 10];
          uVar17 = pUVar56[(long)iVar88 + 0xb];
          uVar18 = pUVar56[(long)iVar88 + 0xc];
          uVar19 = pUVar56[(long)iVar88 + 0xd];
          uVar20 = pUVar56[(long)iVar88 + 0xe];
          uVar21 = pUVar56[(long)iVar88 + 0xf];
          uVar22 = pUVar56[(long)iVar88 + 0x10];
          uVar23 = pUVar56[(long)iVar88 + 0x11];
          uVar24 = pUVar56[(long)iVar88 + 0x12];
          uVar25 = pUVar56[(long)iVar88 + 0x13];
          uVar26 = pUVar56[(long)iVar88 + 0x14];
          uVar27 = pUVar56[(long)iVar88 + 0x15];
          uVar28 = pUVar56[(long)iVar88 + 0x16];
          uVar29 = pUVar56[(long)iVar88 + 0x17];
          uVar30 = pUVar56[(long)iVar88 + 0x18];
          uVar31 = pUVar56[(long)iVar88 + 0x19];
          uVar32 = pUVar56[(long)iVar88 + 0x1a];
          uVar33 = pUVar56[(long)iVar88 + 0x1b];
          uVar34 = pUVar56[(long)iVar88 + 0x1c];
          uVar35 = pUVar56[(long)iVar88 + 0x1d];
          uVar36 = pUVar56[(long)iVar88 + 0x1e];
          uVar37 = pUVar56[(long)iVar88 + 0x1f];
          uVar38 = pUVar56[(long)iVar88 + 0x20];
          uVar39 = pUVar56[(long)iVar88 + 0x21];
          uVar40 = pUVar56[(long)iVar88 + 0x22];
          uVar41 = pUVar56[(long)iVar88 + 0x23];
          uVar42 = pUVar56[(long)iVar88 + 0x24];
          uVar43 = pUVar56[(long)iVar88 + 0x25];
          uVar44 = pUVar56[(long)iVar88 + 0x26];
          uVar45 = pUVar56[(long)iVar88 + 0x27];
          uVar46 = pUVar56[(long)iVar88 + 0x28];
          uVar47 = pUVar56[(long)iVar88 + 0x29];
          uVar48 = pUVar56[(long)iVar88 + 0x2a];
          uVar49 = pUVar56[(long)iVar88 + 0x2b];
          uVar50 = pUVar56[(long)iVar88 + 0x2c];
          uVar51 = pUVar56[(long)iVar88 + 0x2d];
          uVar52 = pUVar56[(long)iVar88 + 0x2e];
          uVar53 = pUVar56[(long)iVar88 + 0x2f];
          uVar54 = pUVar56[(long)iVar88 + 0x30];
          uVar55 = pUVar56[(long)iVar88 + 0x31];
          local_1a4 = s->len_pack[uVar7][0] + s->len_pack[uVar6][0] + s->len_pack[uVar8][0] +
                      s->len_pack[uVar9][0] + s->len_pack[uVar10][0] + s->len_pack[uVar11][0] +
                      s->len_pack[uVar12][0] + s->len_pack[uVar13][0] + s->len_pack[uVar14][0] +
                      s->len_pack[uVar15][0] + s->len_pack[uVar16][0] + s->len_pack[uVar17][0] +
                      s->len_pack[uVar18][0] + s->len_pack[uVar19][0] + s->len_pack[uVar20][0] +
                      s->len_pack[uVar21][0] + s->len_pack[uVar22][0] + s->len_pack[uVar23][0] +
                      s->len_pack[uVar24][0] + s->len_pack[uVar25][0] + s->len_pack[uVar26][0] +
                      s->len_pack[uVar27][0] + s->len_pack[uVar28][0] + s->len_pack[uVar29][0] +
                      s->len_pack[uVar30][0] + s->len_pack[uVar31][0] + s->len_pack[uVar32][0] +
                      s->len_pack[uVar33][0] + s->len_pack[uVar34][0] + s->len_pack[uVar35][0] +
                      s->len_pack[uVar36][0] + s->len_pack[uVar37][0] + s->len_pack[uVar38][0] +
                      s->len_pack[uVar39][0] + s->len_pack[uVar40][0] + s->len_pack[uVar41][0] +
                      s->len_pack[uVar42][0] + s->len_pack[uVar43][0] + s->len_pack[uVar44][0] +
                      s->len_pack[uVar45][0] + s->len_pack[uVar46][0] + s->len_pack[uVar47][0] +
                      s->len_pack[uVar48][0] + s->len_pack[uVar49][0] + s->len_pack[uVar50][0] +
                      s->len_pack[uVar51][0] + s->len_pack[uVar52][0] + s->len_pack[uVar53][0] +
                      s->len_pack[uVar54][0] + s->len_pack[uVar55][0];
          local_1a0 = s->len_pack[uVar7][1] + s->len_pack[uVar6][1] + s->len_pack[uVar8][1] +
                      s->len_pack[uVar9][1] + s->len_pack[uVar10][1] + s->len_pack[uVar11][1] +
                      s->len_pack[uVar12][1] + s->len_pack[uVar13][1] + s->len_pack[uVar14][1] +
                      s->len_pack[uVar15][1] + s->len_pack[uVar16][1] + s->len_pack[uVar17][1] +
                      s->len_pack[uVar18][1] + s->len_pack[uVar19][1] + s->len_pack[uVar20][1] +
                      s->len_pack[uVar21][1] + s->len_pack[uVar22][1] + s->len_pack[uVar23][1] +
                      s->len_pack[uVar24][1] + s->len_pack[uVar25][1] + s->len_pack[uVar26][1] +
                      s->len_pack[uVar27][1] + s->len_pack[uVar28][1] + s->len_pack[uVar29][1] +
                      s->len_pack[uVar30][1] + s->len_pack[uVar31][1] + s->len_pack[uVar32][1] +
                      s->len_pack[uVar33][1] + s->len_pack[uVar34][1] + s->len_pack[uVar35][1] +
                      s->len_pack[uVar36][1] + s->len_pack[uVar37][1] + s->len_pack[uVar38][1] +
                      s->len_pack[uVar39][1] + s->len_pack[uVar40][1] + s->len_pack[uVar41][1] +
                      s->len_pack[uVar42][1] + s->len_pack[uVar43][1] + s->len_pack[uVar44][1] +
                      s->len_pack[uVar45][1] + s->len_pack[uVar46][1] + s->len_pack[uVar47][1] +
                      s->len_pack[uVar48][1] + s->len_pack[uVar49][1] + s->len_pack[uVar50][1] +
                      s->len_pack[uVar51][1] + s->len_pack[uVar52][1] + s->len_pack[uVar53][1] +
                      s->len_pack[uVar54][1] + s->len_pack[uVar55][1];
          local_19c = s->len_pack[uVar7][2] + s->len_pack[uVar6][2] + s->len_pack[uVar8][2] +
                      s->len_pack[uVar9][2] + s->len_pack[uVar10][2] + s->len_pack[uVar11][2] +
                      s->len_pack[uVar12][2] + s->len_pack[uVar13][2] + s->len_pack[uVar14][2] +
                      s->len_pack[uVar15][2] + s->len_pack[uVar16][2] + s->len_pack[uVar17][2] +
                      s->len_pack[uVar18][2] + s->len_pack[uVar19][2] + s->len_pack[uVar20][2] +
                      s->len_pack[uVar21][2] + s->len_pack[uVar22][2] + s->len_pack[uVar23][2] +
                      s->len_pack[uVar24][2] + s->len_pack[uVar25][2] + s->len_pack[uVar26][2] +
                      s->len_pack[uVar27][2] + s->len_pack[uVar28][2] + s->len_pack[uVar29][2] +
                      s->len_pack[uVar30][2] + s->len_pack[uVar31][2] + s->len_pack[uVar32][2] +
                      s->len_pack[uVar33][2] + s->len_pack[uVar34][2] + s->len_pack[uVar35][2] +
                      s->len_pack[uVar36][2] + s->len_pack[uVar37][2] + s->len_pack[uVar38][2] +
                      s->len_pack[uVar39][2] + s->len_pack[uVar40][2] + s->len_pack[uVar41][2] +
                      s->len_pack[uVar42][2] + s->len_pack[uVar43][2] + s->len_pack[uVar44][2] +
                      s->len_pack[uVar45][2] + s->len_pack[uVar46][2] + s->len_pack[uVar47][2] +
                      s->len_pack[uVar48][2] + s->len_pack[uVar49][2] + s->len_pack[uVar50][2] +
                      s->len_pack[uVar51][2] + s->len_pack[uVar52][2] + s->len_pack[uVar53][2] +
                      s->len_pack[uVar54][2] + s->len_pack[uVar55][2];
        }
        uVar97 = 0xffffffff;
        uVar102 = 0;
        uVar87 = 999999999;
        do {
          uVar6 = *(ushort *)((long)&local_1a4 + uVar102 * 2);
          uVar94 = uVar87;
          if (uVar6 <= uVar87) {
            uVar94 = (uint)uVar6;
          }
          if (uVar6 < uVar87) {
            uVar97 = uVar102 & 0xffffffff;
          }
          uVar102 = uVar102 + 1;
          uVar87 = uVar94;
        } while (uVar95 != uVar102);
        iVar92 = (int)uVar97;
        (&local_138)[iVar92] = (&local_138)[iVar92] + 1;
        s->selector[uVar83] = (UChar)uVar97;
        if (bVar86 == 0) {
          if (iVar88 <= iVar103) {
            lVar90 = 0;
            do {
              paIVar2[iVar92][pUVar56[iVar88 + lVar90]] =
                   paIVar2[iVar92][pUVar56[iVar88 + lVar90]] + 1;
              lVar90 = lVar90 + 1;
            } while ((iVar103 - iVar88) + 1 != (int)lVar90);
          }
        }
        else {
          paIVar2[iVar92][pUVar56[iVar88]] = paIVar2[iVar92][pUVar56[iVar88]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 1]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 1]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 2]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 2]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 3]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 3]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 4]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 4]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 5]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 5]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 6]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 6]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 7]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 7]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 8]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 8]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 9]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 9]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 10]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 10]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0xb]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0xb]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0xc]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0xc]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0xd]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0xd]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0xe]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0xe]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0xf]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0xf]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x10]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x10]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x11]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x11]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x12]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x12]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x13]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x13]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x14]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x14]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x15]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x15]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x16]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x16]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x17]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x17]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x18]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x18]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x19]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x19]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x1a]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x1a]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x1b]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x1b]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x1c]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x1c]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x1d]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x1d]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x1e]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x1e]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x1f]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x1f]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x20]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x20]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x21]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x21]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x22]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x22]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x23]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x23]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x24]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x24]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x25]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x25]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x26]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x26]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x27]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x27]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x28]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x28]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x29]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x29]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x2a]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x2a]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x2b]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x2b]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x2c]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x2c]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x2d]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x2d]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x2e]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x2e]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x2f]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x2f]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x30]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x30]] + 1;
          paIVar2[iVar92][pUVar56[(long)iVar88 + 0x31]] =
               paIVar2[iVar92][pUVar56[(long)iVar88 + 0x31]] + 1;
        }
        local_198._0_8_ = uVar83 + 1;
        iVar88 = iVar103 + 1;
        iVar92 = s->nMTF;
        uVar95 = local_178;
        uVar97 = local_178;
      } while (iVar88 < iVar92);
    }
    do {
      BZ2_hbMakeCodeLengths(*paUVar111,*paIVar113,local_1a8,0x11);
      uVar95 = uVar95 - 1;
      paUVar111 = paUVar111 + 1;
      paIVar113 = paIVar113 + 1;
    } while (uVar95 != 0);
    uVar87 = (int)local_150 + 1;
    uVar95 = (ulong)uVar87;
  } while (uVar87 != 4);
  uVar83 = local_198._0_8_;
  iVar92 = local_198._0_4_;
  if (0x4652 < iVar92) {
    bz_internal_error(0xbbb);
  }
  lVar90 = uVar97 - 1;
  auVar126._8_4_ = (int)lVar90;
  auVar126._0_8_ = lVar90;
  auVar126._12_4_ = (int)((ulong)lVar90 >> 0x20);
  auVar126 = auVar126 ^ _DAT_005d6240;
  iVar88 = auVar126._0_4_;
  iVar103 = auVar126._4_4_;
  iVar173 = auVar126._8_4_;
  iVar177 = auVar126._12_4_;
  auVar136._0_4_ = -(uint)(iVar88 < -0x80000000);
  auVar136._4_4_ = -(uint)(iVar88 < -0x80000000);
  auVar136._8_4_ = -(uint)(iVar173 < -0x7fffffff);
  auVar136._12_4_ = -(uint)(iVar173 < -0x7fffffff);
  auVar131._0_4_ = -(uint)(iVar103 == -0x80000000);
  auVar131._4_4_ = -(uint)(iVar103 == -0x80000000);
  auVar131._8_4_ = -(uint)(iVar177 == -0x80000000);
  auVar131._12_4_ = -(uint)(iVar177 == -0x80000000);
  auVar131 = auVar131 & auVar136;
  auVar115 = pshuflw(auVar130,auVar131,0xe8);
  auVar137._8_4_ = 0xffffffff;
  auVar137._0_8_ = 0xffffffffffffffff;
  auVar137._12_4_ = 0xffffffff;
  auVar115 = packssdw(auVar115 ^ auVar137,auVar115 ^ auVar137);
  if ((auVar115 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_1c8[0] = '\0';
  }
  auVar132 = packssdw(auVar131,auVar131);
  auVar132 = packssdw(auVar132 ^ auVar137,auVar132 ^ auVar137);
  if ((auVar132._0_4_ >> 0x10 & 1) != 0) {
    local_1c8[1] = 1;
  }
  auVar138._0_4_ = -(uint)(iVar88 < -0x7ffffffe);
  auVar138._4_4_ = -(uint)(iVar88 < -0x7ffffffe);
  auVar138._8_4_ = -(uint)(iVar173 < -0x7ffffffd);
  auVar138._12_4_ = -(uint)(iVar173 < -0x7ffffffd);
  auVar133._0_4_ = -(uint)(iVar103 == -0x80000000);
  auVar133._4_4_ = -(uint)(iVar103 == -0x80000000);
  auVar133._8_4_ = -(uint)(iVar177 == -0x80000000);
  auVar133._12_4_ = -(uint)(iVar177 == -0x80000000);
  auVar133 = auVar133 & auVar138;
  auVar115 = packssdw(auVar115,auVar133);
  auVar139._8_4_ = 0xffffffff;
  auVar139._0_8_ = 0xffffffffffffffff;
  auVar139._12_4_ = 0xffffffff;
  auVar115 = packssdw(auVar115 ^ auVar139,auVar115 ^ auVar139);
  if ((auVar115 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
    local_1c8[2] = 2;
  }
  auVar132 = pshufhw(auVar133,auVar133,0x84);
  auVar132 = packssdw(auVar132 ^ auVar139,auVar132 ^ auVar139);
  if ((auVar132 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
    local_1c8[3] = 3;
  }
  auVar140._0_4_ = -(uint)(iVar88 < -0x7ffffffc);
  auVar140._4_4_ = -(uint)(iVar88 < -0x7ffffffc);
  auVar140._8_4_ = -(uint)(iVar173 < -0x7ffffffb);
  auVar140._12_4_ = -(uint)(iVar173 < -0x7ffffffb);
  auVar134._0_4_ = -(uint)(iVar103 == -0x80000000);
  auVar134._4_4_ = -(uint)(iVar103 == -0x80000000);
  auVar134._8_4_ = -(uint)(iVar177 == -0x80000000);
  auVar134._12_4_ = -(uint)(iVar177 == -0x80000000);
  auVar134 = auVar134 & auVar140;
  auVar115 = pshuflw(auVar115,auVar134,0xe8);
  auVar141._8_4_ = 0xffffffff;
  auVar141._0_8_ = 0xffffffffffffffff;
  auVar141._12_4_ = 0xffffffff;
  auVar115 = packssdw(auVar115 ^ auVar141,auVar115 ^ auVar141);
  if ((auVar115 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_1c8[4] = 4;
  }
  auVar115 = packssdw(auVar134,auVar134);
  auVar115 = packssdw(auVar115 ^ auVar141,auVar115 ^ auVar141);
  if ((auVar115 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
    local_1c8[5] = 5;
  }
  auVar142._0_4_ = -(uint)(iVar88 < (int)DAT_00630390);
  auVar142._4_4_ = -(uint)(iVar88 < (int)DAT_00630390);
  auVar142._8_4_ = -(uint)(iVar173 < DAT_00630390._8_4_);
  auVar142._12_4_ = -(uint)(iVar173 < DAT_00630390._8_4_);
  auVar125._0_4_ = -(uint)(DAT_00630390._4_4_ == iVar103);
  auVar125._4_4_ = -(uint)(DAT_00630390._4_4_ == iVar103);
  auVar125._8_4_ = -(uint)(DAT_00630390._12_4_ == iVar177);
  auVar125._12_4_ = -(uint)(DAT_00630390._12_4_ == iVar177);
  auVar125 = auVar125 & auVar142;
  auVar115 = packssdw(_DAT_00630390,auVar125);
  auVar127._8_4_ = 0xffffffff;
  auVar127._0_8_ = 0xffffffffffffffff;
  auVar127._12_4_ = 0xffffffff;
  auVar115 = packssdw(auVar115 ^ auVar127,auVar115 ^ auVar127);
  if ((auVar115 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
    local_1c8[6] = 6;
  }
  auVar115 = pshufhw(auVar125,auVar125,0x84);
  auVar115 = packssdw(auVar115 ^ auVar127,auVar115 ^ auVar127);
  if ((auVar115 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
    local_1c8[7] = 7;
  }
  if (0 < iVar92) {
    uVar95 = 0;
    UVar105 = local_1c8[0];
    do {
      UVar4 = s->selector[uVar95];
      lVar90 = 0;
      UVar81 = UVar105;
      while (UVar4 != UVar81) {
        UVar5 = local_1c8[lVar90 + 1];
        local_1c8[lVar90 + 1] = UVar81;
        lVar90 = lVar90 + 1;
        UVar105 = UVar4;
        UVar81 = UVar5;
      }
      s->selectorMtf[uVar95] = (UChar)lVar90;
      uVar95 = uVar95 + 1;
    } while (uVar95 != (uVar83 & 0xffffffff));
  }
  uVar95 = 0;
  paUVar111 = paUVar1;
  local_180 = uVar83 & 0xffffffff;
  do {
    uVar94 = 0x20;
    uVar87 = 0;
    if (-2 < iVar93) {
      sVar112 = 0;
      uVar87 = 0;
      do {
        uVar89 = (uint)(*paUVar111)[sVar112];
        if (uVar87 <= (*paUVar111)[sVar112]) {
          uVar87 = uVar89;
        }
        if (uVar94 < uVar89) {
          uVar89 = uVar94;
        }
        uVar94 = uVar89;
        sVar112 = sVar112 + 1;
      } while (local_188 != sVar112);
      if (0x11 < uVar87) {
        bz_internal_error(0xbbc);
      }
      if (uVar94 == 0) {
        bz_internal_error(0xbbd);
      }
    }
    BZ2_hbAssignCodes(s->code[uVar95],paUVar1[uVar95],uVar94,uVar87,local_1a8);
    uVar95 = uVar95 + 1;
    paUVar111 = paUVar111 + 1;
  } while (uVar95 != uVar97);
  lVar90 = 0;
  pBVar98 = local_168;
  do {
    local_1c8[lVar90] = '\0';
    auVar128[0] = -(*pBVar98 == '\0');
    auVar128[1] = -(pBVar98[1] == '\0');
    auVar128[2] = -(pBVar98[2] == '\0');
    auVar128[3] = -(pBVar98[3] == '\0');
    auVar128[4] = -(pBVar98[4] == '\0');
    auVar128[5] = -(pBVar98[5] == '\0');
    auVar128[6] = -(pBVar98[6] == '\0');
    auVar128[7] = -(pBVar98[7] == '\0');
    auVar128[8] = -(pBVar98[8] == '\0');
    auVar128[9] = -(pBVar98[9] == '\0');
    auVar128[10] = -(pBVar98[10] == '\0');
    auVar128[0xb] = -(pBVar98[0xb] == '\0');
    auVar128[0xc] = -(pBVar98[0xc] == '\0');
    auVar128[0xd] = -(pBVar98[0xd] == '\0');
    auVar128[0xe] = -(pBVar98[0xe] == '\0');
    auVar128[0xf] = -(pBVar98[0xf] == '\0');
    if ((ushort)((ushort)(SUB161(auVar128 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar128 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar128 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar128 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar128 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar128 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar128 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar128 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar128 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar128 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar128 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar128 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar128 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar128 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar128 >> 0x77,0) & 1) << 0xe |
                (ushort)(auVar128[0xf] >> 7) << 0xf) != 0xffff) {
      local_1c8[lVar90] = '\x01';
    }
    lVar90 = lVar90 + 1;
    pBVar98 = pBVar98 + 0x10;
  } while (lVar90 != 0x10);
  uVar87 = s->bsBuff;
  iVar92 = s->bsLive;
  lVar90 = 0;
  do {
    if (local_1c8[lVar90] == '\0') {
      if (7 < iVar92) {
        iVar88 = s->numZ;
        do {
          s->zbits[iVar88] = (UChar)(uVar87 >> 0x18);
          iVar88 = s->numZ + 1;
          s->numZ = iVar88;
          uVar87 = s->bsBuff << 8;
          s->bsBuff = uVar87;
          iVar103 = s->bsLive;
          iVar92 = iVar103 + -8;
          s->bsLive = iVar92;
        } while (0xf < iVar103);
      }
    }
    else {
      if (7 < iVar92) {
        iVar88 = s->numZ;
        do {
          s->zbits[iVar88] = (UChar)(uVar87 >> 0x18);
          iVar88 = s->numZ + 1;
          s->numZ = iVar88;
          uVar87 = s->bsBuff << 8;
          s->bsBuff = uVar87;
          iVar103 = s->bsLive;
          iVar92 = iVar103 + -8;
          s->bsLive = iVar92;
        } while (0xf < iVar103);
      }
      uVar87 = uVar87 | 0x80000000U >> ((byte)iVar92 & 0x1f);
    }
    iVar92 = iVar92 + 1;
    s->bsBuff = uVar87;
    s->bsLive = iVar92;
    lVar90 = lVar90 + 1;
  } while (lVar90 != 0x10);
  lVar90 = 0;
  iVar88 = local_198._0_4_;
  do {
    if (local_1c8[lVar90] != '\0') {
      lVar106 = 0;
      do {
        if (local_168[lVar106 + lVar90 * 0x10] == '\0') {
          if (7 < iVar92) {
            iVar103 = s->numZ;
            do {
              s->zbits[iVar103] = (UChar)(uVar87 >> 0x18);
              iVar103 = s->numZ + 1;
              s->numZ = iVar103;
              uVar87 = s->bsBuff << 8;
              s->bsBuff = uVar87;
              iVar173 = s->bsLive;
              iVar92 = iVar173 + -8;
              s->bsLive = iVar92;
            } while (0xf < iVar173);
          }
        }
        else {
          if (7 < iVar92) {
            iVar103 = s->numZ;
            do {
              s->zbits[iVar103] = (UChar)(uVar87 >> 0x18);
              iVar103 = s->numZ + 1;
              s->numZ = iVar103;
              uVar87 = s->bsBuff << 8;
              s->bsBuff = uVar87;
              iVar173 = s->bsLive;
              iVar92 = iVar173 + -8;
              s->bsLive = iVar92;
            } while (0xf < iVar173);
          }
          uVar87 = uVar87 | 0x80000000U >> ((byte)iVar92 & 0x1f);
        }
        iVar92 = iVar92 + 1;
        s->bsBuff = uVar87;
        s->bsLive = iVar92;
        lVar106 = lVar106 + 1;
      } while (lVar106 != 0x10);
    }
    lVar90 = lVar90 + 1;
  } while (lVar90 != 0x10);
  if (7 < iVar92) {
    iVar103 = s->numZ;
    do {
      s->zbits[iVar103] = (UChar)(uVar87 >> 0x18);
      iVar103 = s->numZ + 1;
      s->numZ = iVar103;
      uVar87 = s->bsBuff << 8;
      s->bsBuff = uVar87;
      iVar173 = s->bsLive;
      iVar92 = iVar173 + -8;
      s->bsLive = iVar92;
    } while (0xf < iVar173);
  }
  iVar103 = iVar92 + 3;
  uVar87 = (uint)uVar97 << (0x1dU - (char)iVar92 & 0x1f) | uVar87;
  s->bsBuff = uVar87;
  s->bsLive = iVar103;
  if (4 < iVar92) {
    iVar92 = s->numZ;
    do {
      s->zbits[iVar92] = (UChar)(uVar87 >> 0x18);
      iVar92 = s->numZ + 1;
      s->numZ = iVar92;
      uVar87 = s->bsBuff << 8;
      s->bsBuff = uVar87;
      iVar173 = s->bsLive;
      iVar103 = iVar173 + -8;
      s->bsLive = iVar103;
    } while (0xf < iVar173);
  }
  iVar92 = iVar103 + 0xf;
  uVar87 = iVar88 << (0x11U - (char)iVar103 & 0x1f) | uVar87;
  s->bsBuff = uVar87;
  s->bsLive = iVar92;
  if (0 < iVar88) {
    uVar95 = 0;
    do {
      bVar85 = s->selectorMtf[uVar95];
      if (bVar85 != 0) {
        uVar94 = 0;
        do {
          if (7 < iVar92) {
            iVar103 = s->numZ;
            do {
              s->zbits[iVar103] = (UChar)(uVar87 >> 0x18);
              iVar103 = s->numZ + 1;
              s->numZ = iVar103;
              uVar87 = s->bsBuff << 8;
              s->bsBuff = uVar87;
              iVar173 = s->bsLive;
              iVar92 = iVar173 + -8;
              s->bsLive = iVar92;
            } while (0xf < iVar173);
            bVar85 = s->selectorMtf[uVar95];
          }
          bVar86 = (byte)iVar92;
          iVar92 = iVar92 + 1;
          uVar87 = uVar87 | 0x80000000U >> (bVar86 & 0x1f);
          s->bsBuff = uVar87;
          s->bsLive = iVar92;
          uVar94 = uVar94 + 1;
        } while (uVar94 < bVar85);
      }
      if (7 < iVar92) {
        iVar103 = s->numZ;
        do {
          s->zbits[iVar103] = (UChar)(uVar87 >> 0x18);
          iVar103 = s->numZ + 1;
          s->numZ = iVar103;
          uVar87 = s->bsBuff << 8;
          s->bsBuff = uVar87;
          iVar173 = s->bsLive;
          iVar92 = iVar173 + -8;
          s->bsLive = iVar92;
        } while (0xf < iVar173);
      }
      iVar92 = iVar92 + 1;
      s->bsBuff = uVar87;
      s->bsLive = iVar92;
      uVar95 = uVar95 + 1;
    } while (uVar95 != local_180);
  }
  uVar95 = 0;
  do {
    bVar85 = paUVar1[uVar95][0];
    uVar94 = (uint)bVar85;
    if (7 < iVar92) {
      iVar103 = s->numZ;
      do {
        s->zbits[iVar103] = (UChar)(uVar87 >> 0x18);
        iVar103 = s->numZ + 1;
        s->numZ = iVar103;
        uVar87 = s->bsBuff << 8;
        s->bsBuff = uVar87;
        iVar173 = s->bsLive;
        iVar92 = iVar173 + -8;
        s->bsLive = iVar92;
      } while (0xf < iVar173);
    }
    iVar103 = iVar92 + 5;
    uVar87 = (uint)bVar85 << (0x1bU - (char)iVar92 & 0x1f) | uVar87;
    s->bsBuff = uVar87;
    s->bsLive = iVar103;
    iVar92 = iVar103;
    if (-2 < iVar93) {
      sVar112 = 0;
      do {
        bVar85 = paUVar1[uVar95][sVar112];
        for (; (int)uVar94 < (int)(uint)bVar85; uVar94 = uVar94 + 1) {
          if (7 < iVar92) {
            iVar103 = s->numZ;
            do {
              s->zbits[iVar103] = (UChar)(uVar87 >> 0x18);
              iVar103 = s->numZ + 1;
              s->numZ = iVar103;
              uVar87 = s->bsBuff << 8;
              s->bsBuff = uVar87;
              iVar173 = s->bsLive;
              iVar92 = iVar173 + -8;
              s->bsLive = iVar92;
            } while (0xf < iVar173);
          }
          cVar107 = (char)iVar92;
          iVar92 = iVar92 + 2;
          uVar87 = uVar87 | 2 << (0x1eU - cVar107 & 0x1f);
          s->bsBuff = uVar87;
          s->bsLive = iVar92;
          bVar85 = paUVar1[uVar95][sVar112];
        }
        if (bVar85 < uVar94) {
          do {
            if (7 < iVar92) {
              iVar103 = s->numZ;
              do {
                s->zbits[iVar103] = (UChar)(uVar87 >> 0x18);
                iVar103 = s->numZ + 1;
                s->numZ = iVar103;
                uVar87 = s->bsBuff << 8;
                s->bsBuff = uVar87;
                iVar173 = s->bsLive;
                iVar92 = iVar173 + -8;
                s->bsLive = iVar92;
              } while (0xf < iVar173);
            }
            cVar107 = (char)iVar92;
            iVar92 = iVar92 + 2;
            uVar87 = uVar87 | 3 << (0x1eU - cVar107 & 0x1f);
            s->bsBuff = uVar87;
            s->bsLive = iVar92;
            uVar94 = uVar94 - 1;
          } while ((int)(uint)paUVar1[uVar95][sVar112] < (int)uVar94);
        }
        if (7 < iVar92) {
          iVar103 = s->numZ;
          do {
            s->zbits[iVar103] = (UChar)(uVar87 >> 0x18);
            iVar103 = s->numZ + 1;
            s->numZ = iVar103;
            uVar87 = s->bsBuff << 8;
            s->bsBuff = uVar87;
            iVar173 = s->bsLive;
            iVar92 = iVar173 + -8;
            s->bsLive = iVar92;
          } while (0xf < iVar173);
        }
        iVar92 = iVar92 + 1;
        s->bsBuff = uVar87;
        s->bsLive = iVar92;
        sVar112 = sVar112 + 1;
      } while (sVar112 != local_188);
    }
    uVar95 = uVar95 + 1;
  } while (uVar95 != uVar97);
  iVar93 = s->nMTF;
  lVar90 = 0;
  if (0 < iVar93) {
    iVar92 = 0;
    do {
      iVar88 = iVar93 + -1;
      if (iVar92 + 0x31 < iVar93) {
        iVar88 = iVar92 + 0x31;
      }
      if ((uint)uVar97 <= (uint)s->selector[lVar90]) {
        bz_internal_error(0xbbe);
      }
      if (((byte)local_1b0 & iVar88 - iVar92 == 0x31) == 0) {
        if (iVar92 <= iVar88) {
          lVar106 = (long)iVar92;
          uVar87 = s->bsBuff;
          iVar93 = s->bsLive;
          do {
            bVar85 = s->selector[lVar90];
            bVar86 = (*paUVar1)[(ulong)pUVar56[lVar106] + (ulong)bVar85 * 0x100 + (ulong)bVar85 * 2]
            ;
            iVar92 = s->code[0][(ulong)bVar85 * 2 + (ulong)bVar85 * 0x100 + (ulong)pUVar56[lVar106]]
            ;
            if (7 < iVar93) {
              IVar109 = s->numZ;
              do {
                s->zbits[IVar109] = (UChar)(uVar87 >> 0x18);
                IVar109 = s->numZ + 1;
                s->numZ = IVar109;
                uVar87 = s->bsBuff << 8;
                s->bsBuff = uVar87;
                iVar103 = s->bsLive;
                iVar93 = iVar103 + -8;
                s->bsLive = iVar93;
              } while (0xf < iVar103);
            }
            iVar93 = iVar93 + (uint)bVar86;
            uVar87 = uVar87 | iVar92 << (-(char)iVar93 & 0x1fU);
            s->bsBuff = uVar87;
            s->bsLive = iVar93;
            lVar106 = lVar106 + 1;
          } while (iVar88 + 1 != (int)lVar106);
        }
      }
      else {
        bVar85 = s->selector[lVar90];
        uVar102 = (ulong)bVar85;
        lVar106 = (ulong)bVar85 * 0x100 + uVar102 * 2;
        uVar95 = (ulong)bVar85;
        bVar85 = (*paUVar1)[(ulong)pUVar56[iVar92] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[iVar92]];
        UVar108 = s->bsBuff;
        iVar93 = s->bsLive;
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 1] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 1]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 2] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 2]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 3] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 3]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 4] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 4]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 5] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 5]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 6] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 6]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 7] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 7]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 8] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 8]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 9] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 9]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 10] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 10]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0xb] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0xb]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0xc] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0xc]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0xd] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0xd]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0xe] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0xe]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0xf] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0xf]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x10] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x10]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x11] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x11]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x12] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x12]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x13] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x13]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x14] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x14]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x15] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x15]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x16] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x16]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x17] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x17]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x18] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x18]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x19] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x19]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x1a] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x1a]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x1b] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x1b]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x1c] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x1c]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x1d] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x1d]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x1e] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x1e]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x1f] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x1f]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x20] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x20]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x21] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x21]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x22] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x22]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x23] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x23]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x24] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x24]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x25] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x25]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x26] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x26]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x27] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x27]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x28] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x28]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x29] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x29]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x2a] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x2a]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x2b] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x2b]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x2c] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x2c]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x2d] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x2d]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x2e] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x2e]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x2f] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x2f]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x30] + lVar106];
        iVar103 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x30]];
        if (7 < iVar93) {
          IVar109 = s->numZ;
          do {
            s->zbits[IVar109] = (UChar)(UVar108 >> 0x18);
            IVar109 = s->numZ + 1;
            s->numZ = IVar109;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        UVar108 = iVar103 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsBuff = UVar108;
        s->bsLive = iVar93;
        bVar85 = (*paUVar1)[(ulong)pUVar56[(long)iVar92 + 0x31] + lVar106];
        iVar92 = s->code[0][uVar102 * 2 + uVar95 * 0x100 + (ulong)pUVar56[(long)iVar92 + 0x31]];
        if (7 < iVar93) {
          iVar103 = s->numZ;
          do {
            s->zbits[iVar103] = (UChar)(UVar108 >> 0x18);
            iVar103 = s->numZ + 1;
            s->numZ = iVar103;
            UVar108 = s->bsBuff << 8;
            s->bsBuff = UVar108;
            iVar173 = s->bsLive;
            iVar93 = iVar173 + -8;
            s->bsLive = iVar93;
          } while (0xf < iVar173);
        }
        iVar93 = iVar93 + (uint)bVar85;
        s->bsBuff = iVar92 << (-(char)iVar93 & 0x1fU) | UVar108;
        s->bsLive = iVar93;
      }
      iVar92 = iVar88 + 1;
      lVar90 = lVar90 + 1;
      iVar93 = s->nMTF;
    } while (iVar92 < iVar93);
    iVar88 = local_198._0_4_;
  }
  is_last_block = (Bool)local_16c;
  if ((int)lVar90 != iVar88) {
    bz_internal_error(0xbbf);
  }
LAB_005717c8:
  if (is_last_block != '\0') {
    bsPutUChar(s,'\x17');
    bsPutUChar(s,'r');
    bsPutUChar(s,'E');
    bsPutUChar(s,'8');
    bsPutUChar(s,'P');
    bsPutUChar(s,0x90);
    bsPutUInt32(s,s->combinedCRC);
    if (0 < s->bsLive) {
      UVar108 = s->bsBuff;
      iVar93 = s->numZ;
      do {
        s->zbits[iVar93] = (UChar)(UVar108 >> 0x18);
        iVar93 = s->numZ + 1;
        s->numZ = iVar93;
        UVar108 = s->bsBuff << 8;
        s->bsBuff = UVar108;
        iVar92 = s->bsLive;
        s->bsLive = iVar92 + -8;
      } while (8 < iVar92);
    }
  }
  return;
}

Assistant:

void BZ2_compressBlock ( EState* s, Bool is_last_block )
{
   if (s->nblock > 0) {

      BZ_FINALISE_CRC ( s->blockCRC );
      s->combinedCRC = (s->combinedCRC << 1) | (s->combinedCRC >> 31);
      s->combinedCRC ^= s->blockCRC;
      if (s->blockNo > 1) s->numZ = 0;

      if (s->verbosity >= 2)
         VPrintf4( "    block %d: crc = 0x%08x, "
                   "combined CRC = 0x%08x, size = %d\n",
                   s->blockNo, s->blockCRC, s->combinedCRC, s->nblock );

      BZ2_blockSort ( s );
   }

   s->zbits = (UChar*) (&((UChar*)s->arr2)[s->nblock]);

   /*-- If this is the first block, create the stream header. --*/
   if (s->blockNo == 1) {
      BZ2_bsInitWrite ( s );
      bsPutUChar ( s, BZ_HDR_B );
      bsPutUChar ( s, BZ_HDR_Z );
      bsPutUChar ( s, BZ_HDR_h );
      bsPutUChar ( s, (UChar)(BZ_HDR_0 + s->blockSize100k) );
   }

   if (s->nblock > 0) {

      bsPutUChar ( s, 0x31 ); bsPutUChar ( s, 0x41 );
      bsPutUChar ( s, 0x59 ); bsPutUChar ( s, 0x26 );
      bsPutUChar ( s, 0x53 ); bsPutUChar ( s, 0x59 );

      /*-- Now the block's CRC, so it is in a known place. --*/
      bsPutUInt32 ( s, s->blockCRC );

      /*-- 
         Now a single bit indicating (non-)randomisation. 
         As of version 0.9.5, we use a better sorting algorithm
         which makes randomisation unnecessary.  So always set
         the randomised bit to 'no'.  Of course, the decoder
         still needs to be able to handle randomised blocks
         so as to maintain backwards compatibility with
         older versions of bzip2.
      --*/
      bsW(s,1,0);

      bsW ( s, 24, s->origPtr );
      generateMTFValues ( s );
      sendMTFValues ( s );
   }


   /*-- If this is the last block, add the stream trailer. --*/
   if (is_last_block) {

      bsPutUChar ( s, 0x17 ); bsPutUChar ( s, 0x72 );
      bsPutUChar ( s, 0x45 ); bsPutUChar ( s, 0x38 );
      bsPutUChar ( s, 0x50 ); bsPutUChar ( s, 0x90 );
      bsPutUInt32 ( s, s->combinedCRC );
      if (s->verbosity >= 2)
         VPrintf1( "    final combined CRC = 0x%08x\n   ", s->combinedCRC );
      bsFinishWrite ( s );
   }
}